

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmHandleManager::delete_obj(CVmHandleManager *this)

{
  long *in_RDI;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < (ulong)in_RDI[2]; local_10 = local_10 + 1) {
    if (*(long *)(in_RDI[1] + local_10 * 8) != 0) {
      (**(code **)(*in_RDI + 0x10))
                (in_RDI,(int)local_10 + 1,*(undefined8 *)(in_RDI[1] + local_10 * 8));
    }
  }
  if (in_RDI != (long *)0x0) {
    (**(code **)(*in_RDI + 8))();
  }
  return;
}

Assistant:

void CVmHandleManager::delete_obj(VMG0_)
{
    size_t i;

    /* 
     *   Delete each remaining object.  Note that we need to call the virtual
     *   delete_handle_object routine, so we must do this before reaching the
     *   destructor (once in the base class destructor, we no longer have
     *   access to the subclass virtuals).  
     */
    for (i = 0 ; i < handles_max_ ; ++i)
    {
        /* if this banner is still valid, delete it */
        if (handles_[i] != 0)
            delete_handle_object(vmg_ i + 1, handles_[i]);
    }

    /* delete the object */
    delete this;
}